

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::Validator::validateTypeId(Validator *this,uint64_t id,Which expectedKind)

{
  Which *pWVar1;
  Impl *this_00;
  CapTableReader *pCVar2;
  SegmentReader *pSVar3;
  char (*in_R8) [2];
  Which WVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  StringPtr name;
  Which expectedKind_local;
  uint local_c8;
  uint local_c4;
  Fault f;
  Reader node;
  DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which_&> _kjCondition;
  uint64_t id_local;
  undefined1 local_58 [16];
  WirePointer *local_48;
  int local_40;
  
  expectedKind_local = expectedKind;
  _kjCondition._0_8_ = id;
  id_local = id;
  kj::
  Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
  ::find<0ul,unsigned_long&>
            ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
              *)&node,(unsigned_long *)&this->loader->schemas);
  if ((node._reader.segment == (SegmentReader *)0x0) ||
     (pWVar1 = *(Which **)&(node._reader.segment)->id, pWVar1 == (Which *)0x0)) {
    this_00 = this->loader;
    kj::str<char_const(&)[23],capnp::Text::Reader&,char_const(&)[2]>
              ((String *)&node,(kj *)"(unknown type used by ",(char (*) [23])&this->nodeName,
               (Reader *)0x502b17,in_R8);
    pSVar3 = node._reader.segment;
    if (node._reader.capTable == (CapTableReader *)0x0) {
      pSVar3 = (SegmentReader *)0x524569;
    }
    name.content.size_ =
         (long)&(node._reader.capTable)->_vptr_CapTableReader +
         (ulong)(node._reader.capTable == (CapTableReader *)0x0);
    name.content.ptr = (char *)pSVar3;
    _kjCondition.right = (Which *)Impl::loadEmpty(this_00,id,name,expectedKind,true);
    local_58._0_8_ = &f;
    _kjCondition._0_8_ = id;
    kj::
    Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
    ::
    upsert<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_2_>(unsigned_long,capnp::_::RawSchema*,capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_2_&&)::_lambda(kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&,kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&&)_1_>
              ((Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
                *)&this->dependencies,(Entry *)&_kjCondition,(anon_class_8_1_6f242a07 *)local_58);
    pCVar2 = node._reader.capTable;
    pSVar3 = node._reader.segment;
    if (node._reader.segment != (SegmentReader *)0x0) {
      node._reader.segment = (SegmentReader *)0x0;
      node._reader.capTable = (CapTableReader *)0x0;
      (*(code *)**node._reader.data)(node._reader.data,pSVar3,1,pCVar2,pCVar2,0);
    }
  }
  else {
    _kjCondition.op.content.ptr = *(char **)(pWVar1 + 4);
    _kjCondition.left = FILE;
    _kjCondition._2_6_ = 0;
    _kjCondition.right = (Which *)0x0;
    _kjCondition.op.content.size_ = CONCAT44(_kjCondition.op.content.size_._4_4_,0x7fffffff);
    WVar4 = FILE;
    local_58._8_8_ = local_58._12_8_;
    capnp::_::PointerReader::getStruct(&node._reader,(PointerReader *)&_kjCondition,(word *)0x0);
    if (0x6f < node._reader.dataSize) {
      WVar4 = *(Which *)((long)node._reader.data + 0xc);
    }
    _kjCondition.left = WVar4;
    _kjCondition.right = &expectedKind_local;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = WVar4 == expectedKind;
    if (_kjCondition.result) {
      local_58._0_8_ = &f;
      _kjCondition._0_8_ = id;
      _kjCondition.right = pWVar1;
      kj::
      Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
      ::
      upsert<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_1_>(unsigned_long,capnp::_::RawSchema*,capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&,kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&&)_1_>
                ((Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
                  *)&this->dependencies,(Entry *)&_kjCondition,(anon_class_8_1_6f242a07 *)local_58);
    }
    else {
      local_c8 = 0;
      local_c4 = (uint)expectedKind;
      if (0x6f < node._reader.dataSize) {
        local_c8 = (uint)*(ushort *)((long)node._reader.data + 0xc);
      }
      bVar5 = node._reader.pointerCount == 0;
      local_48 = node._reader.pointers;
      if (bVar5) {
        local_48 = (WirePointer *)0x0;
      }
      local_40 = 0x7fffffff;
      if (!bVar5) {
        local_40 = node._reader.nestingLimit;
      }
      local_58._0_4_ = 0;
      local_58._4_4_ = 0;
      uVar6 = 0;
      uVar7 = 0;
      if (!bVar5) {
        local_58._0_4_ = node._reader.segment._0_4_;
        local_58._4_4_ = node._reader.segment._4_4_;
        uVar6 = node._reader.capTable._0_4_;
        uVar7 = node._reader.capTable._4_4_;
      }
      local_58._8_4_ = uVar6;
      local_58._12_4_ = uVar7;
      local_58 = (undefined1  [16])
                 capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)local_58,(void *)0x0,0);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which&>&,char_const(&)[46],unsigned_long&,unsigned_int,unsigned_int,capnp::Text::Reader>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x260,FAILED,"node.which() == expectedKind",
                 "_kjCondition,\"expected a different kind of node for this ID\", id, (uint)expectedKind, (uint)node.which(), node.getDisplayName()"
                 ,&_kjCondition,(char (*) [46])"expected a different kind of node for this ID",
                 &id_local,&local_c4,&local_c8,(Reader *)local_58);
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
    }
  }
  return;
}

Assistant:

void validateTypeId(uint64_t id, schema::Node::Which expectedKind) {
    _::RawSchema* existing = loader.tryGet(id).schema;
    if (existing != nullptr) {
      auto node = readMessageUnchecked<schema::Node>(existing->encodedNode);
      VALIDATE_SCHEMA(node.which() == expectedKind,
          "expected a different kind of node for this ID",
          id, (uint)expectedKind, (uint)node.which(), node.getDisplayName());
      dependencies.upsert(id, existing, [](auto&,auto&&) { /* ignore dupe */ });
      return;
    }

    dependencies.upsert(id, loader.loadEmpty(
        id, kj::str("(unknown type used by ", nodeName , ")"), expectedKind, true),
        [](auto&,auto&&) { /* ignore dupe */ });
  }